

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

bytecode_t * __thiscall tchecker::ta::system_t::guard_bytecode(system_t *this,edge_id_t id)

{
  bool bVar1;
  
  bVar1 = tchecker::system::edges_t::is_edge
                    (&(this->super_system_t).super_system_t.super_edges_t,id);
  if (bVar1) {
    return (this->_guards).
           super__Vector_base<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
           ._M_impl.super__Vector_impl_data._M_start[id]._compiled_expr.
           super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  __assert_fail("is_edge(id)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                ,0x51,
                "const tchecker::bytecode_t *tchecker::ta::system_t::guard_bytecode(tchecker::edge_id_t) const"
               );
}

Assistant:

tchecker::bytecode_t const * system_t::guard_bytecode(tchecker::edge_id_t id) const
{
  assert(is_edge(id));
  return _guards[id]._compiled_expr.get();
}